

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext,_4UL>
         ::Construct(DB *db,LIST *params)

{
  IfcGeometricRepresentationContext *in;
  
  in = (IfcGeometricRepresentationContext *)operator_new(0xc0);
  *(undefined8 *)&in->field_0xb0 = 0;
  *(char **)&in->field_0xb8 = "IfcGeometricRepresentationContext";
  (in->super_IfcRepresentationContext).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined1 **)
   &(in->super_IfcRepresentationContext).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.field_0x10 =
       &(in->super_IfcRepresentationContext).
        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.field_0x20;
  *(undefined8 *)
   &(in->super_IfcRepresentationContext).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.field_0x18 = 0;
  (in->super_IfcRepresentationContext).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.field_0x20 = 0;
  (in->super_IfcRepresentationContext).field_0x30 = 0;
  (in->super_IfcRepresentationContext).ContextType.ptr._M_dataplus._M_p =
       (pointer)&(in->super_IfcRepresentationContext).ContextType.ptr.field_2;
  (in->super_IfcRepresentationContext).ContextType.ptr._M_string_length = 0;
  (in->super_IfcRepresentationContext).ContextType.ptr.field_2._M_local_buf[0] = '\0';
  (in->super_IfcRepresentationContext).ContextType.have = false;
  *(undefined8 *)&(in->super_IfcRepresentationContext).field_0x68 = 0;
  (in->super_IfcRepresentationContext).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcGeometricRepresentationContext_0085c280;
  *(undefined ***)&in->field_0xa8 = &PTR__IfcGeometricRepresentationContext_0085c2d0;
  *(undefined ***)&(in->super_IfcRepresentationContext).field_0x60 =
       &PTR__IfcGeometricRepresentationContext_0085c2a8;
  (in->Precision).have = false;
  (in->WorldCoordinateSystem).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (in->WorldCoordinateSystem).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(in->WorldCoordinateSystem).
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 1) = 0;
  *(undefined8 *)((long)&(in->TrueNorth).ptr.obj + 1) = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcRepresentationContext).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcRepresentationContext).
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }